

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>::
~BasicBufferCase(BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                 *this)

{
  BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
  *this_local;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BasicBufferCase_032b83e8;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[3])();
  std::
  vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  ::~vector(&this->m_results);
  std::vector<int,_std::allocator<int>_>::~vector(&this->m_iterationOrder);
  gles3::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

BasicBufferCase<SampleType>::~BasicBufferCase (void)
{
	deinit();
}